

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_is_a(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_BOOL *it_is)

{
  REF_INT local_3c;
  REF_INT local_38;
  int local_34;
  REF_INT local_30;
  int local_2c;
  REF_INT geom;
  REF_INT item;
  REF_BOOL *it_is_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  *it_is = 0;
  if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
    local_34 = -1;
  }
  else {
    local_34 = ref_geom->ref_adj->first[node];
  }
  local_2c = local_34;
  if (local_34 == -1) {
    local_38 = -1;
  }
  else {
    local_38 = ref_geom->ref_adj->item[local_34].ref;
  }
  local_30 = local_38;
  while( true ) {
    if (local_2c == -1) {
      return 0;
    }
    if (type == ref_geom->descr[local_30 * 6]) break;
    local_2c = ref_geom->ref_adj->item[local_2c].next;
    if (local_2c == -1) {
      local_3c = -1;
    }
    else {
      local_3c = ref_geom->ref_adj->item[local_2c].ref;
    }
    local_30 = local_3c;
  }
  *it_is = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_is_a(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_BOOL *it_is) {
  REF_INT item, geom;
  *it_is = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      *it_is = REF_TRUE;
      return REF_SUCCESS;
    }
  }
  return REF_SUCCESS;
}